

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::java::anon_unknown_0::GenerateGetBitInternal
                   (string *__return_storage_ptr__,string *prefix,int bitIndex)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 local_90 [8];
  string varName;
  long local_60;
  long lStack_58;
  undefined1 local_50 [8];
  string mask;
  
  iVar5 = bitIndex + 0x1f;
  if (-1 < bitIndex) {
    iVar5 = bitIndex;
  }
  GetBitFieldName_abi_cxx11_((string *)local_50,(java *)(ulong)(uint)(iVar5 >> 5),bitIndex);
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)local_50,0,(char *)0x0,(ulong)(prefix->_M_dataplus)._M_p);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    varName._M_string_length = *psVar3;
    varName.field_2._M_allocated_capacity = plVar2[3];
    local_90 = (undefined1  [8])&varName._M_string_length;
  }
  else {
    varName._M_string_length = *psVar3;
    local_90 = (undefined1  [8])*plVar2;
  }
  varName._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50 != (undefined1  [8])&mask._M_string_length) {
    operator_delete((void *)local_50);
  }
  std::__cxx11::string::string
            ((string *)local_50,*(char **)(bit_masks + (long)(bitIndex % 0x20) * 8),
             (allocator *)(varName.field_2._M_local_buf + 8));
  std::operator+(&local_d0,"((",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
    varName.field_2._8_8_ = &local_60;
  }
  else {
    local_60 = *plVar4;
    varName.field_2._8_8_ = (long *)*plVar2;
  }
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append(varName.field_2._M_local_buf + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((long *)varName.field_2._8_8_ != &local_60) {
    operator_delete((void *)varName.field_2._8_8_);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_50 != (undefined1  [8])&mask._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (local_90 != (undefined1  [8])&varName._M_string_length) {
    operator_delete((void *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateGetBitInternal(const std::string& prefix, int bitIndex) {
  std::string varName = prefix + GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = "((" + varName + " & " + mask + ") != 0)";
  return result;
}